

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall
OpenMesh::PolyConnectivity::split_copy(PolyConnectivity *this,FaceHandle fh,VertexHandle vh)

{
  value_type _fh_to;
  undefined1 local_40 [8];
  VertexFaceIter vf_it;
  
  split(this,fh,vh);
  Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              *)local_40,this,(VertexHandle)vh.super_BaseHandle.idx_,false);
  if (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1) {
    do {
      if (((int)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return;
      }
      _fh_to = Iterators::
               GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
               ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                            *)local_40);
      BaseKernel::copy_all_properties
                ((BaseKernel *)this,(FaceHandle)fh.super_BaseHandle.idx_,
                 (FaceHandle)_fh_to.super_BaseHandle.idx_,false);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)local_40);
    } while (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  return;
}

Assistant:

void PolyConnectivity::split_copy(FaceHandle fh, VertexHandle vh) {

  // Split the given face (fh will still be valid)
  split(fh, vh);

  // Copy the property of the original face to all new faces
  for(VertexFaceIter vf_it =  vf_iter(vh); vf_it.is_valid(); ++vf_it)
    copy_all_properties(fh, *vf_it);
}